

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_libgcc-inl.h
# Opt level: O2

_Unwind_Reason_Code libgcc_backtrace_helper(_Unwind_Context *ctx,void *_data)

{
  int iVar1;
  undefined8 uVar2;
  
  if (*(int *)((long)_data + 8) < 1) {
    if (*(int *)((long)_data + 0xc) < *(int *)((long)_data + 0x10)) {
      uVar2 = _Unwind_GetIP();
      iVar1 = *(int *)((long)_data + 0xc);
      *(int *)((long)_data + 0xc) = iVar1 + 1;
      *(undefined8 *)(*_data + (long)iVar1 * 8) = uVar2;
    }
  }
  else {
    *(int *)((long)_data + 8) = *(int *)((long)_data + 8) + -1;
  }
  return _URC_NO_REASON;
}

Assistant:

static _Unwind_Reason_Code libgcc_backtrace_helper(struct _Unwind_Context *ctx,
                                                   void *_data) {
  libgcc_backtrace_data *data =
    reinterpret_cast<libgcc_backtrace_data *>(_data);

  if (data->skip > 0) {
    data->skip--;
    return _URC_NO_REASON;
  }

  if (data->pos < data->limit) {
    void *ip = reinterpret_cast<void *>(_Unwind_GetIP(ctx));;
    data->array[data->pos++] = ip;
  }

  return _URC_NO_REASON;
}